

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall
QWidget::render(QWidget *this,QPainter *painter,QPoint *targetOffset,QRegion *sourceRegion,
               RenderFlags renderFlags)

{
  long *plVar1;
  long *plVar2;
  undefined1 *puVar3;
  QWidgetPrivate *this_00;
  QPaintEnginePrivate *this_01;
  long lVar4;
  QWidgetPrivate *pQVar5;
  char cVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  QWExtra *pQVar11;
  long lVar12;
  QPaintDevice *target;
  long lVar13;
  QPaintEnginePrivate *pQVar14;
  undefined8 *puVar15;
  QPaintEnginePrivate *pQVar16;
  byte bVar17;
  long in_FS_OFFSET;
  ulong uVar18;
  double dVar19;
  QRegion painterClip;
  QRegion oldSystemViewport;
  QRegion oldBaseClip;
  QRegion oldSystemClip;
  QRegion toBePainted;
  undefined8 local_100;
  QRegion local_b8;
  QRegion local_b0;
  QRegion local_a8;
  QRegion local_a0;
  QRegion local_98;
  QRegion local_90;
  ushort local_40;
  long local_38;
  
  bVar8 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (painter == (QPainter *)0x0) {
    render();
  }
  else {
    cVar6 = QPainter::isActive();
    if (cVar6 == '\0') {
      render();
    }
    else {
      dVar19 = (double)QPainter::opacity();
      uVar18 = -(ulong)(dVar19 < -dVar19);
      if (1e-12 < (double)(~uVar18 & (ulong)dVar19 | (ulong)-dVar19 & uVar18)) {
        this_00 = *(QWidgetPrivate **)&this->field_0x8;
        pQVar11 = (this_00->extra)._M_t.
                  super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                  super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                  super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
        if ((pQVar11 == (QWExtra *)0x0) ||
           (local_90.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa,
           (*(ushort *)&pQVar11->field_0x7c & 0x40) == 0)) {
          local_90.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QWidgetPrivate::prepareToRender
                    ((QWidgetPrivate *)&stack0xffffffffffffff70,(QRegion *)this_00,
                     (QFlagsStorageHelper<QWidget::RenderFlag,_4>)SUB84(sourceRegion,0));
          bVar17 = 0;
        }
        else {
          QRegion::QRegion(&stack0xffffffffffffff70,sourceRegion);
          bVar17 = 1;
        }
        cVar6 = QRegion::isEmpty();
        if (cVar6 == '\0') {
          pQVar11 = (this_00->extra)._M_t.
                    super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                    super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                    super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
          if (pQVar11 == (QWExtra *)0x0) {
            QWidgetPrivate::createExtra(this_00);
            pQVar11 = (this_00->extra)._M_t.
                      super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                      super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                      super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
          }
          pQVar11->field_0x7c = pQVar11->field_0x7c | 0x40;
          lVar12 = QPainter::paintEngine();
          this_01 = *(QPaintEnginePrivate **)(lVar12 + 0x18);
          target = (QPaintDevice *)QPaintEngine::paintDevice();
          if ((bVar17 != 0) ||
             ((1.0 <= dVar19 && (iVar9 = (**(code **)(*(long *)target + 0x10))(), iVar9 != 4)))) {
            lVar12 = *(long *)&this_00->field_0x8;
            lVar13 = lVar12;
            do {
              plVar1 = (long *)(lVar13 + 8);
              lVar4 = *(long *)(*plVar1 + 0x10);
              if (lVar4 == 0) break;
              plVar2 = (long *)(lVar13 + 0x20);
              lVar13 = lVar4;
            } while ((*(uint *)(*plVar2 + 0xc) & 1) == 0);
            lVar13 = *(long *)(*plVar1 + 0x78);
            if ((lVar13 == 0) || (lVar13 = *(long *)(lVar13 + 8), lVar13 == 0)) {
              local_100 = 0;
            }
            else {
              local_100 = *(undefined8 *)(lVar13 + 0x18);
            }
            do {
              pQVar5 = *(QWidgetPrivate **)(lVar12 + 8);
              if (*(long *)&pQVar5->field_0x10 == 0) break;
              plVar1 = (long *)(lVar12 + 0x20);
              lVar12 = *(long *)&pQVar5->field_0x10;
            } while ((*(uint *)(*plVar1 + 0xc) & 1) == 0);
            QWidgetPrivate::createTLExtra(pQVar5);
            *(QPainter **)
             ((long)(((pQVar5->extra)._M_t.
                      super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                      super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                      super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                    super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x18) =
                 painter;
            pQVar14 = this_01 + 0x40;
            puVar15 = (undefined8 *)&stack0xffffffffffffff78;
            for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
              *puVar15 = *(undefined8 *)pQVar14;
              pQVar14 = pQVar14 + (ulong)bVar8 * -0x10 + 8;
              puVar15 = puVar15 + (ulong)bVar8 * -2 + 1;
            }
            local_98.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion::QRegion(&local_98,(QRegion *)(this_01 + 0x20));
            local_a0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion::QRegion(&local_a0,(QRegion *)(this_01 + 0x18));
            local_a8.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar14 = this_01 + 0x38;
            QRegion::QRegion(&local_a8,(QRegion *)pQVar14);
            QPainter::layoutDirection();
            cVar6 = QPainter::hasClipping();
            if (cVar6 == '\0') {
              QRegion::operator=((QRegion *)pQVar14,&local_98);
              bVar7 = QRegion::isEmpty();
              this_01[0x98] =
                   (QPaintEnginePrivate)((byte)this_01[0x98] & 0xfd | (bVar7 ^ 1) * '\x02');
              QPaintEnginePrivate::updateSystemClip(this_01);
              if (*(long *)(*(long *)(this_01 + 0x10) + 8) != 0) {
                (**(code **)(*(long *)this_01 + 0x10))(this_01);
              }
            }
            else {
              local_b0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
              QPainter::deviceTransform();
              QPainter::clipRegion();
              QTransform::map(&local_b0);
              QRegion::~QRegion(&local_b8);
              cVar6 = QRegion::isEmpty();
              if (cVar6 == '\0') {
                QRegion::operator&(&local_b8,&local_98);
              }
              else {
                QRegion::QRegion(&local_b8,&local_b0);
              }
              QRegion::operator=((QRegion *)pQVar14,&local_b8);
              bVar7 = QRegion::isEmpty();
              this_01[0x98] =
                   (QPaintEnginePrivate)((byte)this_01[0x98] & 0xfd | (bVar7 ^ 1) * '\x02');
              QPaintEnginePrivate::updateSystemClip(this_01);
              if (*(long *)(*(long *)(this_01 + 0x10) + 8) != 0) {
                (**(code **)(*(long *)this_01 + 0x10))(this_01);
              }
              QRegion::~QRegion(&local_b8);
              QRegion::~QRegion(&local_b0);
            }
            QPainter::setLayoutDirection((LayoutDirection)painter);
            QWidgetPrivate::render(this_00,target,targetOffset,&stack0xffffffffffffff70,renderFlags)
            ;
            QRegion::operator=((QRegion *)(this_01 + 0x18),&local_a0);
            puVar15 = (undefined8 *)&stack0xffffffffffffff78;
            pQVar16 = this_01 + 0x40;
            for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
              *(undefined8 *)pQVar16 = *puVar15;
              puVar15 = puVar15 + (ulong)bVar8 * -2 + 1;
              pQVar16 = pQVar16 + (ulong)bVar8 * -0x10 + 8;
            }
            *(ushort *)(this_01 + 0x88) = local_40;
            if ((local_40 & 0x3e0) == 0) {
              uVar10 = local_40 & 0x1f;
            }
            else {
              uVar10 = QTransform::type();
            }
            this_01[0x98] = (QPaintEnginePrivate)((byte)this_01[0x98] & 0xfe | uVar10 != 0);
            QRegion::operator=((QRegion *)pQVar14,&local_a8);
            bVar8 = QRegion::isEmpty();
            this_01[0x98] = (QPaintEnginePrivate)((byte)this_01[0x98] & 0xfd | (bVar8 ^ 1) * '\x02')
            ;
            QPaintEnginePrivate::updateSystemClip(this_01);
            if (*(long *)(*(long *)(this_01 + 0x10) + 8) != 0) {
              (**(code **)(*(long *)this_01 + 0x10))(this_01);
            }
            (**(code **)(*(long *)this_01 + 0x10))(this_01);
            QPainter::setLayoutDirection((LayoutDirection)painter);
            lVar12 = *(long *)&this_00->field_0x8;
            do {
              pQVar5 = *(QWidgetPrivate **)(lVar12 + 8);
              if (*(long *)&pQVar5->field_0x10 == 0) break;
              plVar1 = (long *)(lVar12 + 0x20);
              lVar12 = *(long *)&pQVar5->field_0x10;
            } while ((*(uint *)(*plVar1 + 0xc) & 1) == 0);
            QWidgetPrivate::createTLExtra(pQVar5);
            *(undefined8 *)
             ((long)(((pQVar5->extra)._M_t.
                      super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                      super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                      super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                    super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x18) =
                 local_100;
            pQVar11 = (this_00->extra)._M_t.
                      super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                      super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                      super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
            *(ushort *)&pQVar11->field_0x7c =
                 (ushort)*(undefined4 *)&pQVar11->field_0x7c & 0xffbf | (ushort)bVar17 << 6;
            QRegion::~QRegion(&local_a8);
            QRegion::~QRegion(&local_a0);
            QRegion::~QRegion(&local_98);
          }
          else {
            QWidgetPrivate::render_helper
                      (this_00,painter,targetOffset,&stack0xffffffffffffff70,renderFlags);
            puVar3 = &((this_00->extra)._M_t.
                       super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                       super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                       super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
            *(ushort *)puVar3 = *(ushort *)puVar3 & 0xffbf;
          }
        }
        QRegion::~QRegion(&stack0xffffffffffffff70);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::render(QPainter *painter, const QPoint &targetOffset,
                     const QRegion &sourceRegion, RenderFlags renderFlags)
{
    if (Q_UNLIKELY(!painter)) {
        qWarning("QWidget::render: Null pointer to painter");
        return;
    }

    if (Q_UNLIKELY(!painter->isActive())) {
        qWarning("QWidget::render: Cannot render with an inactive painter");
        return;
    }

    const qreal opacity = painter->opacity();
    if (qFuzzyIsNull(opacity))
        return; // Fully transparent.

    Q_D(QWidget);
    const bool inRenderWithPainter = d->extra && d->extra->inRenderWithPainter;
    const QRegion toBePainted = !inRenderWithPainter ? d->prepareToRender(sourceRegion, renderFlags)
                                                     : sourceRegion;
    if (toBePainted.isEmpty())
        return;

    if (!d->extra)
        d->createExtra();
    d->extra->inRenderWithPainter = true;

    QPaintEngine *engine = painter->paintEngine();
    Q_ASSERT(engine);
    QPaintEnginePrivate *enginePriv = engine->d_func();
    Q_ASSERT(enginePriv);
    QPaintDevice *target = engine->paintDevice();
    Q_ASSERT(target);

    // Render via a pixmap when dealing with non-opaque painters or printers.
    if (!inRenderWithPainter && (opacity < 1.0 || (target->devType() == QInternal::Printer))) {
        d->render_helper(painter, targetOffset, toBePainted, renderFlags);
        d->extra->inRenderWithPainter = inRenderWithPainter;
        return;
    }

    // Set new shared painter.
    QPainter *oldPainter = d->sharedPainter();
    d->setSharedPainter(painter);

    // Save current system clip, viewport and transform,
    const QTransform oldTransform = enginePriv->systemTransform;
    const QRegion oldSystemClip = enginePriv->systemClip;
    const QRegion oldBaseClip = enginePriv->baseSystemClip;
    const QRegion oldSystemViewport = enginePriv->systemViewport;
    const Qt::LayoutDirection oldLayoutDirection = painter->layoutDirection();

    // This ensures that all painting triggered by render() is clipped to the current engine clip.
    if (painter->hasClipping()) {
        const QRegion painterClip = painter->deviceTransform().map(painter->clipRegion());
        enginePriv->setSystemViewport(oldSystemClip.isEmpty() ? painterClip : oldSystemClip & painterClip);
    } else {
        enginePriv->setSystemViewport(oldSystemClip);
    }
    painter->setLayoutDirection(layoutDirection());

    d->render(target, targetOffset, toBePainted, renderFlags);

    // Restore system clip, viewport and transform.
    enginePriv->baseSystemClip = oldBaseClip;
    enginePriv->setSystemTransformAndViewport(oldTransform, oldSystemViewport);
    enginePriv->systemStateChanged();
    painter->setLayoutDirection(oldLayoutDirection);

    // Restore shared painter.
    d->setSharedPainter(oldPainter);

    d->extra->inRenderWithPainter = inRenderWithPainter;
}